

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O2

void PrefAdSize(PDISASM pMyDisasm)

{
  Int32 *pIVar1;
  UIntPtr UVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = Security(2,pMyDisasm);
  if (iVar3 != 0) {
    (pMyDisasm->Prefix).AddressSize = '\x01';
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    ResetREX(pMyDisasm);
    UVar2 = (pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Reserved_).EIP_ = UVar2 + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    pIVar1 = &(pMyDisasm->Reserved_).NB_PREFIX;
    *pIVar1 = *pIVar1 + 1;
    iVar3 = (pMyDisasm->Reserved_).AddressSize;
    iVar4 = iVar3 * 2;
    if ((pMyDisasm->Reserved_).Architecture != 0x10) {
      iVar4 = iVar3 >> 1;
    }
    (pMyDisasm->Reserved_).AddressSize = iVar4;
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(UVar2 + 1);
    (*opcode_map1[*(byte *)(UVar2 + 1)])(pMyDisasm);
    iVar3 = (pMyDisasm->Reserved_).AddressSize;
    iVar4 = iVar3 >> 1;
    if ((pMyDisasm->Reserved_).Architecture != 0x10) {
      iVar4 = iVar3 * 2;
    }
    (pMyDisasm->Reserved_).AddressSize = iVar4;
  }
  return;
}

Assistant:

void __bea_callspec__ PrefAdSize(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    pMyDisasm->Prefix.AddressSize = InUsePrefix;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    if (GV.Architecture == 16) {
        GV.AddressSize = GV.AddressSize << 1;
    }
    else {
        GV.AddressSize = GV.AddressSize >> 1;
    }

    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
    if (GV.Architecture == 16) {
        GV.AddressSize = GV.AddressSize >> 1;
    }
    else {
        GV.AddressSize = GV.AddressSize << 1;
    }

}